

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O1

void nni_http_client_fini(nni_http_client *c)

{
  nni_aio_stop(&c->aio);
  nng_stream_dialer_stop(c->dialer);
  nni_aio_fini(&c->aio);
  nng_stream_dialer_free(c->dialer);
  nni_mtx_fini(&c->mtx);
  nni_free(c,800);
  return;
}

Assistant:

void
nni_http_client_fini(nni_http_client *c)
{
	nni_aio_stop(&c->aio);
	nng_stream_dialer_stop(c->dialer);
	nni_aio_fini(&c->aio);
	nng_stream_dialer_free(c->dialer);
	nni_mtx_fini(&c->mtx);
	NNI_FREE_STRUCT(c);
}